

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplace_back<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,DistItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  Expression *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pDVar9;
  pointer pDVar10;
  bool bVar11;
  undefined7 uVar12;
  pointer pDVar13;
  long lVar14;
  long lVar15;
  pointer __src;
  ulong uVar16;
  long lVar17;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    pEVar5 = args->value;
    uVar6 = *(undefined8 *)
             &(args->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
    bVar11 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
             ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
             _M_engaged;
    uVar12 = *(undefined7 *)
              &(args->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
    (__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
    _M_value.expr =
         (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
         _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
         _M_value.expr;
    (__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
         bVar11;
    *(undefined7 *)
     &(__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
         uVar12;
    __src->value = pEVar5;
    *(undefined8 *)
     &(__src->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
         uVar6;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x3ffffffffffffff - uVar4 < uVar4) {
    uVar16 = 0x3ffffffffffffff;
  }
  lVar17 = (long)__src - (long)this->data_;
  pDVar13 = (pointer)operator_new(uVar16 << 5);
  pEVar5 = args->value;
  uVar6 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar7 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar13 + lVar17 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar7;
  *(undefined8 *)((long)pDVar13 + lVar17) = pEVar5;
  ((undefined8 *)((long)pDVar13 + lVar17))[1] = uVar6;
  p = this->data_;
  lVar14 = this->len * 0x20;
  lVar15 = (long)p + (lVar14 - (long)__src);
  pDVar9 = p;
  pDVar10 = pDVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->value + lVar15);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&(p->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar15 + 8);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pDVar13->weight).
                         super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                         _M_payload + lVar15 + 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&pDVar13->value + lVar15);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        lVar15 = lVar15 + 0x20;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pDVar9 != __src; pDVar9 = pDVar9 + 1) {
      pEVar5 = pDVar9->value;
      uVar6 = *(undefined8 *)
               &(pDVar9->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar11 = (pDVar9->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar12 = *(undefined7 *)
                &(pDVar9->weight).
                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload
                 .super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar9->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
           ._M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
           _M_payload._M_value.expr;
      (pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar11;
      *(undefined7 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar12;
      pDVar10->value = pEVar5;
      *(undefined8 *)
       &(pDVar10->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar6;
      pDVar10 = pDVar10 + 1;
    }
    memcpy((void *)((long)pDVar13 + lVar17 + 0x20),__src,
           (lVar15 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pDVar13;
  return (reference)((long)pDVar13 + lVar17);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }